

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeNormalizedCase::test
          (VertexAttributeNormalizedCase *this)

{
  CallLogWrapper *this_00;
  uint stride;
  TestLog *pTVar1;
  GLenum GVar2;
  ulong uVar3;
  long lVar4;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  ScopedLogSection section;
  GLfloat vertexData [4];
  GLint aGStack_1c8 [3];
  byte abStack_1bc [4];
  PointerData pointers [16];
  
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)pointers,"DefaultVAO",&local_1e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexData,"Test with default VAO",&local_1e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)pointers,(string *)vertexData);
  std::__cxx11::string::~string((string *)vertexData);
  std::__cxx11::string::~string((string *)pointers);
  pointers[0].size = 1;
  pointers[0].type = 0x1400;
  pointers[0].stride = 0;
  pointers[0].normalized = '\0';
  pointers[0].pointer = (string *)vertexData;
  pointers[1].size = 1;
  pointers[1].type = 0x1402;
  pointers[1].stride = 0;
  pointers[1].normalized = '\0';
  pointers[1].pointer = (string *)vertexData;
  uVar3 = 0x140400000001;
  pointers[2].size = 1;
  pointers[2].type = 0x1404;
  pointers[2].stride = 0;
  pointers[2].normalized = '\0';
  pointers[2].pointer = (string *)vertexData;
  pointers[3].size = 1;
  pointers[3].type = 0x1401;
  pointers[3].stride = 0;
  pointers[3].normalized = '\0';
  pointers[3].pointer = (string *)vertexData;
  pointers[4].size = 1;
  pointers[4].type = 0x1403;
  pointers[4].stride = 0;
  pointers[4].normalized = '\0';
  pointers[4].pointer = (string *)vertexData;
  pointers[5].size = 1;
  pointers[5].type = 0x1405;
  pointers[5].stride = 0;
  pointers[5].normalized = '\0';
  pointers[5].pointer = (string *)vertexData;
  pointers[6].size = 4;
  pointers[6].type = 0x8d9f;
  pointers[6].stride = 0;
  pointers[6].normalized = '\0';
  pointers[6].pointer = (string *)vertexData;
  pointers[7].size = 4;
  pointers[7].type = 0x8368;
  pointers[7].stride = 0;
  pointers[7].normalized = '\0';
  pointers[7].pointer = (string *)vertexData;
  pointers[8].size = 1;
  pointers[8].type = 0x1400;
  pointers[8].stride = 0;
  pointers[8].normalized = '\x01';
  pointers[8].pointer = (string *)vertexData;
  pointers[9].size = 1;
  pointers[9].type = 0x1402;
  pointers[9].stride = 0;
  pointers[9].normalized = '\x01';
  pointers[9].pointer = (string *)vertexData;
  pointers[10].size = 1;
  pointers[10].type = 0x1404;
  pointers[10].stride = 0;
  pointers[10].normalized = '\x01';
  pointers[10].pointer = (string *)vertexData;
  pointers[0xb].size = 1;
  pointers[0xb].type = 0x1401;
  pointers[0xb].stride = 0;
  pointers[0xb].normalized = '\x01';
  pointers[0xb].pointer = (string *)vertexData;
  pointers[0xc].size = 1;
  pointers[0xc].type = 0x1403;
  pointers[0xc].stride = 0;
  pointers[0xc].normalized = '\x01';
  pointers[0xc].pointer = (string *)vertexData;
  pointers[0xd].size = 1;
  pointers[0xd].type = 0x1405;
  pointers[0xd].stride = 0;
  pointers[0xd].normalized = '\x01';
  pointers[0xd].pointer = (string *)vertexData;
  pointers[0xe].size = 4;
  pointers[0xe].type = 0x8d9f;
  pointers[0xe].stride = 0;
  vertexData[0] = 0.0;
  vertexData[1] = 0.0;
  vertexData[2] = 0.0;
  vertexData[3] = 0.0;
  pointers[0xe].normalized = '\x01';
  pointers[0xe].pointer = (string *)vertexData;
  pointers[0xf].size = 4;
  pointers[0xf].type = 0x8368;
  pointers[0xf].stride = 0;
  pointers[0xf].normalized = '\x01';
  pointers[0xf].pointer = (string *)vertexData;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  for (lVar4 = 0x10; lVar4 != 400; lVar4 = lVar4 + 0x18) {
    uVar3 = (ulong)abStack_1bc[lVar4];
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)aGStack_1c8 + lVar4),
               *(GLenum *)((long)aGStack_1c8 + lVar4 + 4),abStack_1bc[lVar4],
               *(GLsizei *)((long)aGStack_1c8 + lVar4 + 8),
               *(void **)((long)&pointers[0].size + lVar4));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x886a,(uint)abStack_1bc[lVar4],(GLenum)uVar3);
  }
  pointers[0].size = 1;
  pointers[0].type = 0x1400;
  pointers[0].stride = 0;
  pointers[0].pointer = (string *)vertexData;
  pointers[1].size = 1;
  pointers[1].type = 0x1402;
  pointers[1].stride = 0;
  pointers[1].pointer = (string *)vertexData;
  pointers[2].size = 1;
  pointers[2].type = 0x1404;
  pointers[2].stride = 0;
  pointers[2].pointer = (string *)vertexData;
  pointers[3].size = 1;
  pointers[3].type = 0x1401;
  pointers[3].stride = 0;
  pointers[3].pointer = (string *)vertexData;
  pointers[4].size = 1;
  pointers[4].type = 0x1403;
  pointers[4].stride = 0;
  pointers[4].pointer = (string *)vertexData;
  pointers[5].size = 1;
  pointers[5].type = 0x1405;
  pointers[5].stride = 0;
  pointers[5].pointer = (string *)vertexData;
  for (lVar4 = 0x10; GVar2 = (GLenum)uVar3, lVar4 != 0xa0; lVar4 = lVar4 + 0x18) {
    stride = *(uint *)((long)aGStack_1c8 + lVar4 + 8);
    uVar3 = (ulong)stride;
    glu::CallLogWrapper::glVertexAttribIPointer
              (this_00,0,*(GLint *)((long)aGStack_1c8 + lVar4),
               *(GLenum *)((long)aGStack_1c8 + lVar4 + 4),stride,
               *(void **)((long)&pointers[0].size + lVar4));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x886a,0,(GLenum)uVar3);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)pointers,"WithVAO",&local_1e1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)vertexData,"Test with VAO",&local_1e2);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)pointers,(string *)vertexData);
  std::__cxx11::string::~string((string *)vertexData);
  std::__cxx11::string::~string((string *)pointers);
  vertexData._0_8_ = vertexData._0_8_ & 0xffffffff00000000;
  pointers[0].size = 0;
  pointers[0].type = 0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,(GLuint *)pointers);
  glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)vertexData);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)vertexData[0]);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,pointers[0].size);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x886a,0,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1404,'\x01',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,pointers[0].type);
  GVar2 = 0;
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1404,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x886a,0,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,pointers[0].size);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x886a,1,GVar2);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,(GLuint *)pointers);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)vertexData);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			const GLfloat vertexData[4] = {0.0f}; // never accessed

			// test VertexAttribPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE,	vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE,	vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE,	vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE,	vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE,	vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE,	vertexData	},
					{ 4, GL_INT_2_10_10_10_REV,					0,	GL_FALSE,	vertexData	},
					{ 4, GL_UNSIGNED_INT_2_10_10_10_REV,		0,	GL_FALSE,	vertexData	},
					{ 1, GL_BYTE,								0,	GL_TRUE,	vertexData	},
					{ 1, GL_SHORT,								0,	GL_TRUE,	vertexData	},
					{ 1, GL_INT,								0,	GL_TRUE,	vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_TRUE,	vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_TRUE,	vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_TRUE,	vertexData	},
					{ 4, GL_INT_2_10_10_10_REV,					0,	GL_TRUE,	vertexData	},
					{ 4, GL_UNSIGNED_INT_2_10_10_10_REV,		0,	GL_TRUE,	vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, pointers[ndx].normalized);
				}
			}

			// test glVertexAttribIPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,				0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,				0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,				0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,		0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,		0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,		0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribIPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_FALSE);
				}
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_FALSE);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, 1, GL_INT, GL_TRUE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, 1, GL_INT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_FALSE);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_TRUE);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}